

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::emplaceRealloc<>
          (SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> *this,pointer pos)

{
  ulong uVar1;
  size_type sVar2;
  _Storage<slang::ConstantRange,_true> *p_Var3;
  undefined8 uVar4;
  _Storage<slang::ConstantRange,_true> _Var5;
  pointer pLVar6;
  pointer pLVar7;
  LoopDim *__cur;
  pointer pLVar8;
  long lVar9;
  EVP_PKEY_CTX *ctx;
  ulong capacity;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = this->len + 1;
  uVar1 = this->cap;
  if (capacity < uVar1 * 2) {
    capacity = uVar1 * 2;
  }
  if (0x7fffffffffffffff - uVar1 < uVar1) {
    capacity = 0x7fffffffffffffff;
  }
  lVar9 = (long)pos - (long)this->data_;
  ctx = (EVP_PKEY_CTX *)0x18;
  pLVar6 = (pointer)detail::allocArray(capacity,0x18);
  *(undefined8 *)((long)pLVar6 + lVar9) = 0;
  ((undefined8 *)((long)pLVar6 + lVar9))[1] = 0;
  *(undefined8 *)((long)pLVar6 + lVar9 + 0x10) = 0;
  pLVar7 = this->data_;
  pLVar8 = pLVar6;
  if (pLVar7 + this->len == pos) {
    for (; pLVar7 != pos; pLVar7 = pLVar7 + 1) {
      pLVar8->loopVar = pLVar7->loopVar;
      uVar4 = *(undefined8 *)
               &(pLVar7->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ConstantRange>._M_engaged;
      (pLVar8->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::ConstantRange>._M_payload =
           (pLVar7->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::ConstantRange>._M_payload;
      *(undefined8 *)
       &(pLVar8->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::ConstantRange>._M_engaged = uVar4;
      pLVar8 = pLVar8 + 1;
    }
  }
  else {
    for (; pLVar7 != pos; pLVar7 = pLVar7 + 1) {
      pLVar8->loopVar = pLVar7->loopVar;
      uVar4 = *(undefined8 *)
               &(pLVar7->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ConstantRange>._M_engaged;
      (pLVar8->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::ConstantRange>._M_payload =
           (pLVar7->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::ConstantRange>._M_payload;
      *(undefined8 *)
       &(pLVar8->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::ConstantRange>._M_engaged = uVar4;
      pLVar8 = pLVar8 + 1;
    }
    sVar2 = this->len;
    pLVar7 = this->data_;
    p_Var3 = (_Storage<slang::ConstantRange,_true> *)((long)pLVar6 + lVar9);
    for (; pos != pLVar7 + sVar2; pos = pos + 1) {
      p_Var3[5] = (_Storage<slang::ConstantRange,_true>)pos->loopVar;
      _Var5 = *(_Storage<slang::ConstantRange,_true> *)
               &(pos->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ConstantRange>._M_engaged;
      p_Var3[3] = (pos->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                  super__Optional_payload_base<slang::ConstantRange>._M_payload;
      p_Var3[4] = _Var5;
      p_Var3 = p_Var3 + 3;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = pLVar6;
  return (pointer)((long)pLVar6 + lVar9);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}